

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

QStyleOptionMenuItem * __thiscall
QComboMenuDelegate::getStyleOption
          (QStyleOptionMenuItem *__return_storage_ptr__,QComboMenuDelegate *this,
          QStyleOptionViewItem *option,QModelIndex *index)

{
  QPalette *this_00;
  State *pSVar1;
  byte *pbVar2;
  QAbstractItemModel *pQVar3;
  QIconPrivate *pQVar4;
  undefined8 uVar5;
  QArrayData *pQVar6;
  QWidgetData *pQVar7;
  undefined8 uVar8;
  QMetaType QVar9;
  long lVar10;
  Representation RVar11;
  Representation RVar12;
  Representation RVar13;
  QIcon QVar14;
  char cVar15;
  bool bVar16;
  undefined4 uVar17;
  int iVar18;
  QWidget *this_01;
  ulong uVar19;
  QString *pQVar20;
  QMetaType QVar21;
  QByteArray *pQVar22;
  uint uVar23;
  anon_union_24_3_e3d07ef4_for_data *paVar24;
  long in_FS_OFFSET;
  QLatin1String QVar25;
  QIcon moved_2;
  int t_3;
  QBrush t;
  QIcon local_130 [3];
  undefined8 local_118;
  undefined4 local_110;
  QFont local_108 [16];
  QFont local_f8 [16];
  QIcon local_e8;
  undefined1 *puStack_e0;
  undefined1 local_c8 [16];
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined1 *puStack_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined1 *puStack_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined1 *puStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0xaa,0x98);
  QStyleOptionMenuItem::QStyleOptionMenuItem(__return_storage_ptr__);
  local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  paVar24 = &local_58;
  QApplication::palette((QApplication *)paVar24,"QMenu");
  QPalette::resolve((QPalette *)local_c8);
  QPalette::~QPalette((QPalette *)paVar24);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (index->m).ptr;
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (undefined1 *)0x0;
    local_58._16_8_ = (undefined1 *)0x0;
    puStack_40 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x90))(&local_58,pQVar3,index,9);
  }
  cVar15 = QMetaType::canConvert
                     ((QMetaTypeInterface *)((ulong)puStack_40 & 0xfffffffffffffffc),
                      (QMetaType)0x7f9f28);
  if (cVar15 != '\0') {
    local_78.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
    local_98.shared = (PrivateShared *)((ulong)puStack_40 & 0xfffffffffffffffc);
    bVar16 = comparesEqual((QMetaType *)&local_98.shared,(QMetaType *)&local_78.shared);
    if (bVar16) {
      if (((ulong)puStack_40 & 1) == 0) {
        paVar24 = &local_58;
      }
      else {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QBrush::QBrush((QBrush *)local_98.data,(QBrush *)paVar24->data);
    }
    else {
      local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QBrush::QBrush((QBrush *)local_98.data);
      QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_40 & 1) != 0) {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar21,paVar24,(QMetaType)local_78.shared,&local_98);
    }
    QPalette::setBrush((ColorGroup)local_c8,Mid,(QBrush *)0x0);
    QBrush::~QBrush((QBrush *)local_98.data);
    local_78.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
    local_98.shared = (PrivateShared *)((ulong)puStack_40 & 0xfffffffffffffffc);
    bVar16 = comparesEqual((QMetaType *)&local_98.shared,(QMetaType *)&local_78.shared);
    if (bVar16) {
      if (((ulong)puStack_40 & 1) == 0) {
        paVar24 = &local_58;
      }
      else {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QBrush::QBrush((QBrush *)local_98.data,(QBrush *)paVar24->data);
    }
    else {
      local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QBrush::QBrush((QBrush *)local_98.data);
      paVar24 = &local_58;
      QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_40 & 1) != 0) {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar21,paVar24,(QMetaType)local_78.shared,&local_98);
    }
    QPalette::setBrush((ColorGroup)local_c8,Mid,(QBrush *)0x8);
    QBrush::~QBrush((QBrush *)local_98.data);
    local_78.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QBrush>::metaType;
    local_98.shared = (PrivateShared *)((ulong)puStack_40 & 0xfffffffffffffffc);
    bVar16 = comparesEqual((QMetaType *)&local_98.shared,(QMetaType *)&local_78.shared);
    if (bVar16) {
      if (((ulong)puStack_40 & 1) == 0) {
        paVar24 = &local_58;
      }
      else {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QBrush::QBrush((QBrush *)local_98.data,(QBrush *)paVar24->data);
    }
    else {
      local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      QBrush::QBrush((QBrush *)local_98.data);
      paVar24 = &local_58;
      QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_40 & 1) != 0) {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar21,paVar24,(QMetaType)local_78.shared,&local_98);
    }
    QPalette::setBrush((ColorGroup)local_c8,Mid,(QBrush *)0x6);
    QBrush::~QBrush((QBrush *)local_98.data);
  }
  this_00 = &(__return_storage_ptr__->super_QStyleOption).palette;
  QPalette::operator=(this_00,(QPalette *)local_c8);
  (__return_storage_ptr__->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
  .super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  this_01 = QWidget::window(&this->mCombo->super_QWidget);
  bVar16 = QWidget::isActiveWindow(this_01);
  if (bVar16) {
    (__return_storage_ptr__->super_QStyleOption).state.
    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
         0x10000;
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 1) == 0) {
LAB_003d8b9e:
    (__return_storage_ptr__->super_QStyleOption).palette.currentGroup = Disabled;
  }
  else {
    pQVar3 = (index->m).ptr;
    uVar19 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,index);
    if ((uVar19 & 0x20) == 0) goto LAB_003d8b9e;
    pSVar1 = &(__return_storage_ptr__->super_QStyleOption).state;
    *(byte *)&(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000) != 0) {
    pbVar2 = (byte *)((long)&(__return_storage_ptr__->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 1);
    *pbVar2 = *pbVar2 | 0x80;
  }
  __return_storage_ptr__->checkType = NonExclusive;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (index->m).ptr;
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = (undefined1 *)0x0;
    local_78._16_8_ = (undefined1 *)0x0;
    puStack_60 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x90))(&local_78,pQVar3,index,10);
  }
  if (puStack_60 < (undefined1 *)0x4) {
    iVar18 = QPersistentModelIndex::row();
    __return_storage_ptr__->checked = iVar18 == index->r;
  }
  else {
    local_98.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType;
    uVar19 = (ulong)puStack_60 & 0xfffffffffffffffc;
    local_b8._0_4_ = (undefined4)uVar19;
    local_b8._4_2_ = (undefined2)(uVar19 >> 0x20);
    local_b8._6_2_ = (undefined2)(uVar19 >> 0x30);
    bVar16 = comparesEqual((QMetaType *)&local_b8.shared,(QMetaType *)&local_98.shared);
    if (bVar16) {
      if (((ulong)puStack_60 & 1) == 0) {
        paVar24 = &local_78;
      }
      else {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_78.shared + *(int *)(local_78.shared + 4));
      }
      local_b8._0_4_ = *(undefined4 *)paVar24;
    }
    else {
      local_b8._0_4_ = 0;
      paVar24 = &local_78;
      QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_60 & 1) != 0) {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_78.shared + *(int *)(local_78.shared + 4));
      }
      QMetaType::convert(QVar21,paVar24,(QMetaType)local_98.shared,&local_b8);
    }
    __return_storage_ptr__->checked = local_b8._0_4_ == 2;
    local_98.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<int>::metaType;
    uVar19 = (ulong)puStack_60 & 0xfffffffffffffffc;
    local_b8._0_4_ = (undefined4)uVar19;
    local_b8._4_2_ = (undefined2)(uVar19 >> 0x20);
    local_b8._6_2_ = (undefined2)(uVar19 >> 0x30);
    bVar16 = comparesEqual((QMetaType *)&local_b8.shared,(QMetaType *)&local_98.shared);
    if (bVar16) {
      if (((ulong)puStack_60 & 1) == 0) {
        paVar24 = &local_78;
      }
      else {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_78.shared + *(int *)(local_78.shared + 4));
      }
      uVar17 = *(int *)paVar24;
    }
    else {
      local_b8._0_4_ = 0;
      paVar24 = &local_78;
      QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_60 & 1) != 0) {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_78.shared + *(int *)(local_78.shared + 4));
      }
      QMetaType::convert(QVar21,paVar24,(QMetaType)local_98.shared,&local_b8);
      uVar17 = local_b8._0_4_;
    }
    uVar23 = 8;
    if (uVar17 == 2) {
      uVar23 = 0x20;
    }
    pSVar1 = &(__return_storage_ptr__->super_QStyleOption).state;
    (pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).super_QFlagsStorage<QStyle::StateFlag>
    .i = (pSVar1->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
         super_QFlagsStorage<QStyle::StateFlag>.i | uVar23;
  }
  bVar16 = QComboBoxDelegate::isSeparator(index);
  __return_storage_ptr__->menuItemType = (uint)bVar16 * 2;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = (index->m).ptr;
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    local_98.shared = (PrivateShared *)0x0;
    local_98._8_8_ = (undefined1 *)0x0;
    local_98._16_8_ = (undefined1 *)0x0;
    puStack_80 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x90))(&local_98,pQVar3,index,1);
  }
  paVar24 = &local_98;
  iVar18 = ::QVariant::typeId((QVariant *)paVar24);
  if (iVar18 == 0x1003) {
    if (getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap == '\0') {
      getStyleOption();
    }
    local_e8.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QColor>::metaType;
    uVar19 = (ulong)puStack_80 & 0xfffffffffffffffc;
    local_b8._0_4_ = (undefined4)uVar19;
    local_b8._4_2_ = (undefined2)(uVar19 >> 0x20);
    local_b8._6_2_ = (undefined2)(uVar19 >> 0x30);
    bVar16 = comparesEqual((QMetaType *)&local_b8.shared,(QMetaType *)&local_e8);
    if (bVar16) {
      if (((ulong)puStack_80 & 1) == 0) {
        paVar24 = &local_98;
      }
      else {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_98.shared + *(int *)(local_98.shared + 4));
      }
      uVar5 = *(undefined8 *)paVar24;
      uVar8 = *(undefined8 *)(paVar24->data + 8);
      local_b8._0_4_ = (undefined4)uVar5;
      local_b8._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
      local_b8._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
      local_b8._8_4_ = (undefined4)uVar8;
      local_b8._12_2_ = (undefined2)((ulong)uVar8 >> 0x20);
      local_b8._14_2_ = (undefined2)((ulong)uVar8 >> 0x30);
    }
    else {
      local_b8._14_2_ = 0xaaaa;
      local_b8._0_4_ = 0;
      local_b8._4_2_ = 0xffff;
      local_b8._6_2_ = 0;
      local_b8._8_4_ = 0;
      local_b8._12_2_ = 0;
      paVar24 = &local_98;
      QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_80 & 1) != 0) {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_98.shared + *(int *)(local_98.shared + 4));
      }
      QMetaType::convert(QVar21,paVar24,(QMetaType)local_e8.d,&local_b8);
    }
    QPixmap::fill((QColor *)getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap);
    QIcon::QIcon(&local_e8,
                 (QPixmap *)getStyleOption(QStyleOptionViewItem_const&,QModelIndex_const&)::pixmap);
    QVar14.d = local_e8.d;
    local_e8.d = (QIconPrivate *)0x0;
    pQVar4 = (__return_storage_ptr__->icon).d;
    (__return_storage_ptr__->icon).d = QVar14.d;
    local_b8._0_4_ = SUB84(pQVar4,0);
    local_b8._4_2_ = (undefined2)((ulong)pQVar4 >> 0x20);
    local_b8._6_2_ = (undefined2)((ulong)pQVar4 >> 0x30);
    QIcon::~QIcon((QIcon *)&local_b8.shared);
LAB_003d9130:
    QIcon::~QIcon(&local_e8);
  }
  else {
    if (iVar18 == 0x1005) {
      local_b8._0_4_ = 0x7f5f70;
      local_b8._4_2_ = 0;
      local_b8._6_2_ = 0;
      local_e8.d = (QIconPrivate *)((ulong)puStack_80 & 0xfffffffffffffffc);
      bVar16 = comparesEqual((QMetaType *)&local_e8,(QMetaType *)&local_b8.shared);
      if (bVar16) {
        if (((ulong)puStack_80 & 1) == 0) {
          paVar24 = &local_98;
        }
        else {
          paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_98.shared + *(int *)(local_98.shared + 4));
        }
        QIcon::QIcon(&local_e8,(QIcon *)&paVar24->shared);
      }
      else {
        local_e8.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QIcon::QIcon(&local_e8);
        paVar24 = &local_98;
        QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((ulong)puStack_80 & 1) != 0) {
          paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_98.shared + *(int *)(local_98.shared + 4));
        }
        QVar9.d_ptr._4_2_ = local_b8._4_2_;
        QVar9.d_ptr._0_4_ = local_b8._0_4_;
        QVar9.d_ptr._6_2_ = local_b8._6_2_;
        QMetaType::convert(QVar21,paVar24,QVar9,&local_e8);
      }
      QVar14.d = local_e8.d;
      local_e8.d = (QIconPrivate *)0x0;
      pQVar4 = (__return_storage_ptr__->icon).d;
      (__return_storage_ptr__->icon).d = QVar14.d;
      local_b8._0_4_ = SUB84(pQVar4,0);
      local_b8._4_2_ = (undefined2)((ulong)pQVar4 >> 0x20);
      local_b8._6_2_ = (undefined2)((ulong)pQVar4 >> 0x30);
      QIcon::~QIcon((QIcon *)&local_b8.shared);
      goto LAB_003d9130;
    }
    local_e8.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QPixmap>::metaType;
    uVar19 = (ulong)puStack_80 & 0xfffffffffffffffc;
    local_b8._0_4_ = (undefined4)uVar19;
    local_b8._4_2_ = (undefined2)(uVar19 >> 0x20);
    local_b8._6_2_ = (undefined2)(uVar19 >> 0x30);
    bVar16 = comparesEqual((QMetaType *)&local_b8.shared,(QMetaType *)&local_e8);
    if (bVar16) {
      if (((ulong)puStack_80 & 1) == 0) {
        paVar24 = &local_98;
      }
      else {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_98.shared + *(int *)(local_98.shared + 4));
      }
      QPixmap::QPixmap((QPixmap *)local_b8.data,(QPixmap *)paVar24->data);
    }
    else {
      local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_4_ = 0xaaaaaaaa;
      local_b8._4_2_ = 0xaaaa;
      local_b8._6_2_ = 0xaaaa;
      local_b8._8_4_ = 0xaaaaaaaa;
      local_b8._12_2_ = 0xaaaa;
      local_b8._14_2_ = 0xaaaa;
      QPixmap::QPixmap((QPixmap *)local_b8.data);
      QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_80 & 1) != 0) {
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_98.shared + *(int *)(local_98.shared + 4));
      }
      QMetaType::convert(QVar21,paVar24,(QMetaType)local_e8.d,&local_b8);
    }
    QIcon::QIcon(local_130,(QPixmap *)local_b8.data);
    QVar14.d = local_130[0].d;
    local_130[0].d = (QIconPrivate *)0x0;
    local_e8.d = (__return_storage_ptr__->icon).d;
    (__return_storage_ptr__->icon).d = QVar14.d;
    QIcon::~QIcon(&local_e8);
    QIcon::~QIcon(local_130);
    QPixmap::~QPixmap((QPixmap *)local_b8.data);
  }
  pQVar3 = (index->m).ptr;
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    local_b8._0_4_ = 0;
    local_b8._4_2_ = 0;
    local_b8._6_2_ = 0;
    local_b8._8_4_ = 0;
    local_b8._12_2_ = 0;
    local_b8._14_2_ = 0;
    local_b8._16_8_ = (undefined1 *)0x0;
    puStack_a0 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x90))(&local_b8,pQVar3,index,8);
  }
  cVar15 = QMetaType::canConvert
                     ((QMetaTypeInterface *)((ulong)puStack_a0 & 0xfffffffffffffffc),
                      (QMetaType)0x7f9f28);
  ::QVariant::~QVariant((QVariant *)&local_b8);
  if (cVar15 != '\0') {
    pQVar3 = (index->m).ptr;
    if (pQVar3 == (QAbstractItemModel *)0x0) {
      local_b8._0_4_ = 0;
      local_b8._4_2_ = 0;
      local_b8._6_2_ = 0;
      local_b8._8_4_ = 0;
      local_b8._12_2_ = 0;
      local_b8._14_2_ = 0;
      local_b8._16_8_ = (undefined1 *)0x0;
      puStack_a0 = (undefined1 *)0x2;
    }
    else {
      (**(code **)(*(long *)pQVar3 + 0x90))(&local_b8,pQVar3,index,8);
    }
    qvariant_cast<QBrush>((QVariant *)&local_e8);
    QPalette::setBrush((ColorGroup)this_00,Mid,(QBrush *)&DAT_0000000a);
    QBrush::~QBrush((QBrush *)&local_e8);
    ::QVariant::~QVariant((QVariant *)&local_b8);
  }
  pQVar3 = (index->m).ptr;
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    local_b8._0_4_ = 0;
    local_b8._4_2_ = 0;
    local_b8._6_2_ = 0;
    local_b8._8_4_ = 0;
    local_b8._12_2_ = 0;
    local_b8._14_2_ = 0;
    local_b8._16_8_ = (undefined1 *)0x0;
    puStack_a0 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x90))(&local_b8,pQVar3,index,0);
  }
  ::QVariant::toString();
  QVar25.m_data = (char *)0x2;
  QVar25.m_size = 0x26;
  pQVar20 = (QString *)QString::replace((QChar)(char16_t)&local_e8,QVar25,0x6e2914);
  QString::operator=(&__return_storage_ptr__->text,pQVar20);
  if ((QArrayData *)local_e8.d != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_e8.d = *(int *)local_e8.d + -1;
    UNLOCK();
    if (*(int *)local_e8.d == 0) {
      QArrayData::deallocate((QArrayData *)local_e8.d,2,0x10);
    }
  }
  paVar24 = &local_b8;
  ::QVariant::~QVariant((QVariant *)paVar24);
  __return_storage_ptr__->reservedShortcutWidth = 0;
  __return_storage_ptr__->maxIconWidth = (option->decorationSize).wd.m_i + 4;
  RVar11.m_i = (option->super_QStyleOption).rect.y1.m_i;
  RVar12.m_i = (option->super_QStyleOption).rect.x2.m_i;
  RVar13.m_i = (option->super_QStyleOption).rect.y2.m_i;
  (__return_storage_ptr__->menuRect).x1 = (Representation)(option->super_QStyleOption).rect.x1.m_i;
  (__return_storage_ptr__->menuRect).y1 = (Representation)RVar11.m_i;
  (__return_storage_ptr__->menuRect).x2 = (Representation)RVar12.m_i;
  (__return_storage_ptr__->menuRect).y2 = (Representation)RVar13.m_i;
  RVar11.m_i = (option->super_QStyleOption).rect.y1.m_i;
  RVar12.m_i = (option->super_QStyleOption).rect.x2.m_i;
  RVar13.m_i = (option->super_QStyleOption).rect.y2.m_i;
  (__return_storage_ptr__->super_QStyleOption).rect.x1 =
       (Representation)(option->super_QStyleOption).rect.x1.m_i;
  (__return_storage_ptr__->super_QStyleOption).rect.y1 = (Representation)RVar11.m_i;
  (__return_storage_ptr__->super_QStyleOption).rect.x2 = (Representation)RVar12.m_i;
  (__return_storage_ptr__->super_QStyleOption).rect.y2 = (Representation)RVar13.m_i;
  local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_4_ = 0xaaaaaaaa;
  local_b8._4_2_ = 0xaaaa;
  local_b8._6_2_ = 0xaaaa;
  local_b8._8_4_ = 0xaaaaaaaa;
  local_b8._12_2_ = 0xaaaa;
  local_b8._14_2_ = 0xaaaa;
  pQVar3 = (index->m).ptr;
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    local_b8._0_4_ = 0;
    local_b8._4_2_ = 0;
    local_b8._6_2_ = 0;
    local_b8._8_4_ = 0;
    local_b8._12_2_ = 0;
    local_b8._14_2_ = 0;
    local_b8._16_8_ = (undefined1 *)0x0;
    puStack_a0 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x90))(&local_b8,pQVar3,index,6);
  }
  if ((undefined1 *)0x3 < puStack_a0) {
    local_130[0].d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QFont>::metaType;
    local_e8.d = (QIconPrivate *)((ulong)puStack_a0 & 0xfffffffffffffffc);
    bVar16 = comparesEqual((QMetaType *)&local_e8,(QMetaType *)local_130);
    if (bVar16) {
      if (((ulong)puStack_a0 & 1) == 0) {
        paVar24 = &local_b8;
      }
      else {
        lVar10 = CONCAT26(local_b8._6_2_,CONCAT24(local_b8._4_2_,local_b8._0_4_));
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)(*(int *)(lVar10 + 4) + lVar10);
      }
      QFont::QFont((QFont *)&local_e8,(QFont *)paVar24->data);
    }
    else {
      local_e8.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      QFont::QFont((QFont *)&local_e8);
      QVar21.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((ulong)puStack_a0 & 1) != 0) {
        lVar10 = CONCAT26(local_b8._6_2_,CONCAT24(local_b8._4_2_,local_b8._0_4_));
        paVar24 = (anon_union_24_3_e3d07ef4_for_data *)(*(int *)(lVar10 + 4) + lVar10);
      }
      QMetaType::convert(QVar21,paVar24,(QMetaType)local_130[0].d,&local_e8);
    }
    pQVar6 = *(QArrayData **)&__return_storage_ptr__->font;
    *(QIconPrivate **)&__return_storage_ptr__->font = local_e8.d;
    uVar17 = *(undefined4 *)&__return_storage_ptr__->field_0x90;
    *(undefined4 *)&__return_storage_ptr__->field_0x90 = puStack_e0._0_4_;
    puStack_e0 = (undefined1 *)CONCAT44(puStack_e0._4_4_,uVar17);
    local_e8.d = (QIconPrivate *)pQVar6;
    QFont::~QFont((QFont *)&local_e8);
    goto LAB_003d95fa;
  }
  bVar16 = QWidget::testAttribute_helper(&this->mCombo->super_QWidget,WA_SetFont);
  cVar15 = '\x01';
  if (bVar16) {
LAB_003d9468:
    bVar16 = false;
  }
  else {
    bVar16 = QWidget::testAttribute_helper(&this->mCombo->super_QWidget,WA_MacSmallSize);
    if (bVar16) goto LAB_003d9468;
    bVar16 = QWidget::testAttribute_helper(&this->mCombo->super_QWidget,WA_MacMiniSize);
    if (bVar16) goto LAB_003d9468;
    pQVar7 = (this->mCombo->super_QWidget).data;
    pQVar22 = (QByteArray *)qt_app_fonts_hash();
    QByteArray::QByteArray((QByteArray *)&local_e8,"QComboBox",-1);
    QFont::QFont(local_108);
    QHash<QByteArray,_QFont>::value((QHash<QByteArray,_QFont> *)local_f8,pQVar22,(QFont *)&local_e8)
    ;
    cVar15 = QFont::operator!=(&pQVar7->fnt,local_f8);
    bVar16 = true;
  }
  if (bVar16) {
    QFont::~QFont(local_f8);
    QFont::~QFont(local_108);
    if ((QArrayData *)local_e8.d != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_e8.d = *(int *)local_e8.d + -1;
      UNLOCK();
      if (*(int *)local_e8.d == 0) {
        QArrayData::deallocate((QArrayData *)local_e8.d,1,0x10);
      }
    }
  }
  if (cVar15 == '\0') {
    pQVar22 = (QByteArray *)qt_app_fonts_hash();
    QByteArray::QByteArray((QByteArray *)local_130,"QComboMenuItem",-1);
    QHash<QByteArray,_QFont>::value
              ((QHash<QByteArray,_QFont> *)&local_118,pQVar22,(QFont *)local_130);
    uVar5 = *(undefined8 *)&__return_storage_ptr__->font;
    *(undefined8 *)&__return_storage_ptr__->font = local_118;
    uVar17 = *(undefined4 *)&__return_storage_ptr__->field_0x90;
    *(undefined4 *)&__return_storage_ptr__->field_0x90 = local_110;
    local_118 = uVar5;
    local_110 = uVar17;
    QFont::~QFont((QFont *)&local_118);
    if ((InterfaceType *)local_130[0].d != (InterfaceType *)0x0) {
      LOCK();
      *(int *)local_130[0].d = *(int *)local_130[0].d + -1;
      UNLOCK();
      if (*(int *)local_130[0].d == 0) {
        QArrayData::deallocate((QArrayData *)local_130[0].d,1,0x10);
      }
    }
  }
  else {
    QFont::operator=(&__return_storage_ptr__->font,&((this->mCombo->super_QWidget).data)->fnt);
  }
LAB_003d95fa:
  QFontMetrics::QFontMetrics((QFontMetrics *)local_130,&__return_storage_ptr__->font);
  pQVar4 = *(QIconPrivate **)&(__return_storage_ptr__->super_QStyleOption).fontMetrics;
  *(QIconPrivate **)&(__return_storage_ptr__->super_QStyleOption).fontMetrics = local_130[0].d;
  local_130[0].d = pQVar4;
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_130);
  ::QVariant::~QVariant((QVariant *)&local_b8);
  ::QVariant::~QVariant((QVariant *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QPalette::~QPalette((QPalette *)local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStyleOptionMenuItem QComboMenuDelegate::getStyleOption(const QStyleOptionViewItem &option,
                                                        const QModelIndex &index) const
{
    QStyleOptionMenuItem menuOption;

    QPalette resolvedpalette = option.palette.resolve(QApplication::palette("QMenu"));
    QVariant value = index.data(Qt::ForegroundRole);
    if (value.canConvert<QBrush>()) {
        resolvedpalette.setBrush(QPalette::WindowText, qvariant_cast<QBrush>(value));
        resolvedpalette.setBrush(QPalette::ButtonText, qvariant_cast<QBrush>(value));
        resolvedpalette.setBrush(QPalette::Text, qvariant_cast<QBrush>(value));
    }
    menuOption.palette = resolvedpalette;
    menuOption.state = QStyle::State_None;
    if (mCombo->window()->isActiveWindow())
        menuOption.state = QStyle::State_Active;
    if ((option.state & QStyle::State_Enabled) && (index.model()->flags(index) & Qt::ItemIsEnabled))
        menuOption.state |= QStyle::State_Enabled;
    else
        menuOption.palette.setCurrentColorGroup(QPalette::Disabled);
    if (option.state & QStyle::State_Selected)
        menuOption.state |= QStyle::State_Selected;
    menuOption.checkType = QStyleOptionMenuItem::NonExclusive;
    // a valid checkstate means that the model has checkable items
    const QVariant checkState = index.data(Qt::CheckStateRole);
    if (!checkState.isValid()) {
        menuOption.checked = mCombo->currentIndex() == index.row();
    } else {
        menuOption.checked = qvariant_cast<int>(checkState) == Qt::Checked;
        menuOption.state |= qvariant_cast<int>(checkState) == Qt::Checked
                          ? QStyle::State_On : QStyle::State_Off;
    }
    if (QComboBoxDelegate::isSeparator(index))
        menuOption.menuItemType = QStyleOptionMenuItem::Separator;
    else
        menuOption.menuItemType = QStyleOptionMenuItem::Normal;

    const QVariant variant = index.data(Qt::DecorationRole);
    switch (variant.userType()) {
    case QMetaType::QIcon:
        menuOption.icon = qvariant_cast<QIcon>(variant);
        break;
    case QMetaType::QColor: {
        static QPixmap pixmap(option.decorationSize);
        pixmap.fill(qvariant_cast<QColor>(variant));
        menuOption.icon = pixmap;
        break; }
    default:
        menuOption.icon = qvariant_cast<QPixmap>(variant);
        break;
    }
    if (index.data(Qt::BackgroundRole).canConvert<QBrush>()) {
        menuOption.palette.setBrush(QPalette::All, QPalette::Window,
                                    qvariant_cast<QBrush>(index.data(Qt::BackgroundRole)));
    }
    menuOption.text = index.data(Qt::DisplayRole).toString().replace(u'&', "&&"_L1);
    menuOption.reservedShortcutWidth = 0;
    menuOption.maxIconWidth =  option.decorationSize.width() + 4;
    menuOption.menuRect = option.rect;
    menuOption.rect = option.rect;

    // Make sure fonts set on the model or on the combo box, in
    // that order, also override the font for the popup menu.
    QVariant fontRoleData = index.data(Qt::FontRole);
    if (fontRoleData.isValid()) {
        menuOption.font = qvariant_cast<QFont>(fontRoleData);
    } else if (mCombo->testAttribute(Qt::WA_SetFont)
            || mCombo->testAttribute(Qt::WA_MacSmallSize)
            || mCombo->testAttribute(Qt::WA_MacMiniSize)
            || mCombo->font() != qt_app_fonts_hash()->value("QComboBox", QFont())) {
        menuOption.font = mCombo->font();
    } else {
        menuOption.font = qt_app_fonts_hash()->value("QComboMenuItem", mCombo->font());
    }

    menuOption.fontMetrics = QFontMetrics(menuOption.font);

    return menuOption;
}